

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

ofstream * __thiscall ev3dev::anon_unknown_20::ofstream_open(anon_unknown_20 *this,string *path)

{
  item *__s2;
  _List_node_base *p_Var1;
  void *pvVar2;
  char cVar3;
  int iVar4;
  _List_node_base *p_Var5;
  undefined8 uVar6;
  undefined8 *unaff_R12;
  void *unaff_R13;
  void *unaff_R15;
  _List_node_base *p_Var7;
  
  if ((anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ == '\0')
  {
    _GLOBAL__N_1::ofstream_open();
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)
                             (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::mx)
  ;
  p_Var5 = DAT_0011bbd0;
  if (iVar4 != 0) {
    uVar6 = std::__throw_system_error(iVar4);
    if ((void *)*unaff_R12 != unaff_R13) {
      operator_delete((void *)*unaff_R12);
    }
    operator_delete(unaff_R15);
    pthread_mutex_unlock
              ((pthread_mutex_t *)
               (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::mx);
    _Unwind_Resume(uVar6);
  }
  if (DAT_0011bbd0 != (_List_node_base *)&DAT_0011bbd0) {
    __s2 = *(item **)this;
    p_Var1 = *(_List_node_base **)(this + 8);
    p_Var7 = DAT_0011bbd0;
    do {
      if ((p_Var7[1]._M_prev == p_Var1) &&
         ((p_Var1 == (_List_node_base *)0x0 ||
          (path = &__s2->first, iVar4 = bcmp(p_Var7[1]._M_next,__s2,(size_t)p_Var1), iVar4 == 0))))
      {
        if (p_Var7->_M_next != p_Var5 && p_Var5 != p_Var7) {
          std::__detail::_List_node_base::_M_transfer(p_Var5,p_Var7);
        }
        goto LAB_0010ddc0;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&DAT_0011bbd0);
  }
  if ((anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
      DAT_0011bbe0 + 1U) {
    do {
      pvVar2 = DAT_0011bbd8;
      DAT_0011bbe0 = DAT_0011bbe0 + -1;
      std::__detail::_List_node_base::_M_unhook();
      std::
      allocator_traits<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ofstream>::item>>>
      ::destroy<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ofstream>::item>
                ((allocator_type *)((long)pvVar2 + 0x10),(item *)path);
      operator_delete(pvVar2);
    } while ((anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
             DAT_0011bbe0 + 1U);
  }
  p_Var5 = (_List_node_base *)operator_new(0x230);
  p_Var5[1]._M_next = p_Var5 + 2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var5 + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  std::ofstream::ofstream((ofstream *)(p_Var5 + 3));
  std::__detail::_List_node_base::_M_hook(p_Var5);
  DAT_0011bbe0 = DAT_0011bbe0 + 1;
LAB_0010ddc0:
  p_Var1 = DAT_0011bbd0;
  p_Var5 = DAT_0011bbd0 + 3;
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::mx);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    (*(code *)p_Var1[3]._M_prev[1]._M_prev)(&p_Var1[3]._M_prev,0,0);
    std::ofstream::open((string *)p_Var5,(_Ios_Openmode)this);
  }
  else {
    std::ios::clear((int)p_Var5->_M_next[-2]._M_prev + (int)p_Var5);
  }
  return (ofstream *)p_Var5;
}

Assistant:

std::ofstream &ofstream_open(const std::string &path) {
    std::ofstream &file = ofstream_cache(path);
    if (!file.is_open()) {
        // Don't buffer writes to avoid latency. Also saves a bit of memory.
        file.rdbuf()->pubsetbuf(NULL, 0);
        file.open(path);
    } else {
        // Clear the error bits in case something happened.
        file.clear();
    }
    return file;
}